

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_polygon_mesh.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::SimplePolygonMesh::writeMeshObj(SimplePolygonMesh *this,ostream *out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer pVVar4;
  pointer pvVar5;
  pointer pVVar6;
  pointer pvVar7;
  pointer puVar8;
  char cVar9;
  ostream *poVar10;
  pointer pvVar11;
  pointer pVVar12;
  pointer pVVar13;
  pointer pvVar14;
  pointer puVar15;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *__range2;
  
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 0x11;
  ::std::__ostream_insert<char,std::char_traits<char>>
            (out,"# Mesh exported from geometry-central",0x25);
  cVar9 = (char)out;
  ::std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar9);
  ::std::ostream::put(cVar9);
  ::std::ostream::flush();
  ::std::__ostream_insert<char,std::char_traits<char>>(out,"#  vertices: ",0xd);
  poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)out);
  ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  ::std::ostream::put((char)poVar10);
  ::std::ostream::flush();
  ::std::__ostream_insert<char,std::char_traits<char>>(out,"#     faces: ",0xd);
  poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)out);
  ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  ::std::ostream::put((char)poVar10);
  ::std::ostream::flush();
  ::std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar9);
  ::std::ostream::put(cVar9);
  ::std::ostream::flush();
  pVVar4 = (this->vertexCoordinates).
           super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pVVar12 = (this->vertexCoordinates).
                 super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                 ._M_impl.super__Vector_impl_data._M_start; pVVar12 != pVVar4; pVVar12 = pVVar12 + 1
      ) {
    dVar1 = pVVar12->x;
    dVar2 = pVVar12->y;
    dVar3 = pVVar12->z;
    ::std::__ostream_insert<char,std::char_traits<char>>(out,"v ",2);
    poVar10 = ::std::ostream::_M_insert<double>(dVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    poVar10 = ::std::ostream::_M_insert<double>(dVar2);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    poVar10 = ::std::ostream::_M_insert<double>(dVar3);
    ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    ::std::ostream::put((char)poVar10);
    ::std::ostream::flush();
  }
  pvVar5 = (this->paramCoordinates).
           super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar11 = (this->paramCoordinates).
                 super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar11 != pvVar5; pvVar11 = pvVar11 + 1
      ) {
    pVVar6 = (pvVar11->
             super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pVVar13 = (pvVar11->
                   super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                   )._M_impl.super__Vector_impl_data._M_start; pVVar13 != pVVar6;
        pVVar13 = pVVar13 + 1) {
      dVar1 = pVVar13->x;
      dVar2 = pVVar13->y;
      ::std::__ostream_insert<char,std::char_traits<char>>(out,"vt ",3);
      poVar10 = ::std::ostream::_M_insert<double>(dVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      poVar10 = ::std::ostream::_M_insert<double>(dVar2);
      ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      ::std::ostream::put((char)poVar10);
      ::std::ostream::flush();
    }
  }
  pvVar7 = (this->polygons).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar14 = (this->polygons).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar14 != pvVar7; pvVar14 = pvVar14 + 1
      ) {
    ::std::__ostream_insert<char,std::char_traits<char>>(out,"f",1);
    puVar8 = (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar15 = (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start; puVar15 != puVar8;
        puVar15 = puVar15 + 1) {
      ::std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      ::std::ostream::_M_insert<unsigned_long>((ulong)out);
      if ((this->paramCoordinates).
          super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->paramCoordinates).
          super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ::std::__ostream_insert<char,std::char_traits<char>>(out,"/",1);
        ::std::ostream::_M_insert<unsigned_long>((ulong)out);
      }
    }
    ::std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar9);
    ::std::ostream::put(cVar9);
    ::std::ostream::flush();
  }
  return;
}

Assistant:

void SimplePolygonMesh::writeMeshObj(std::ostream& out) {

  // Make sure we write out at full precision
  out << std::setprecision(std::numeric_limits<double>::max_digits10);

  // Write header
  out << "# Mesh exported from geometry-central" << std::endl;
  out << "#  vertices: " << vertexCoordinates.size() << std::endl;
  out << "#     faces: " << polygons.size() << std::endl;
  out << std::endl;

  // Write vertices
  for (Vector3 p : vertexCoordinates) {
    out << "v " << p.x << " " << p.y << " " << p.z << std::endl;
  }


  // Write texture coords (if present)
  for (std::vector<Vector2>& coords : paramCoordinates) {
    for (Vector2 c : coords) {
      out << "vt " << c.x << " " << c.y << std::endl;
    }
  }

  // Write faces
  size_t iC = 0;
  for (std::vector<size_t>& face : polygons) {
    out << "f";
    for (size_t ind : face) {
      out << " " << (ind + 1);

      if (!paramCoordinates.empty()) {
        out << "/" << (iC + 1);
        iC++;
      }
    }
    out << std::endl;
  }
}